

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O3

TConstUnion __thiscall glslang::TConstUnion::operator||(TConstUnion *this,TConstUnion *constant)

{
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar1;
  anon_union_8_11_a9b10978_for_TConstUnion_0 aVar2;
  TConstUnion TVar3;
  
  if (this->type != constant->type) {
    __assert_fail("type == constant.type",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                  ,0x343,"TConstUnion glslang::TConstUnion::operator||(const TConstUnion &) const");
  }
  if (this->type == EbtBool) {
    aVar2.i64Const._1_7_ = 0;
    aVar2.i8Const = (constant->field_0).u8Const;
    aVar1.i64Const = 1;
    if ((this->field_0).i8Const == '\0') {
      aVar1 = aVar2;
    }
    TVar3._8_8_ = 0xc;
    TVar3.field_0.i64Const = aVar1.i64Const;
    return TVar3;
  }
  __assert_fail("false && \"Default missing\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                ,0x346,"TConstUnion glslang::TConstUnion::operator||(const TConstUnion &) const");
}

Assistant:

TConstUnion operator||(const TConstUnion& constant) const
    {
        TConstUnion returnValue;
        assert(type == constant.type);
        switch (type) {
        case EbtBool: returnValue.setBConst(bConst || constant.bConst); break;
        default:     assert(false && "Default missing");
        }

        return returnValue;
    }